

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clique.cc
# Opt level: O0

SearchResult __thiscall
anon_unknown.dwarf_1cc54d::CliqueRunner::expand<false>
          (CliqueRunner *this,int depth,unsigned_long_long *nodes,unsigned_long_long *find_nodes,
          unsigned_long_long *prove_nodes,vector<int,_std::allocator<int>_> *c,SVOBitset *p,
          conditional_t<false,_const_SVOBitset_&,_int> a,int spacepos)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  uint *puVar5;
  pointer pRVar6;
  unsigned_long_long *in_RCX;
  long *in_RDX;
  int *unaff_RBX;
  undefined4 in_ESI;
  anon_class_8_1_54a39803 *in_RDI;
  unsigned_long_long *in_R8;
  vector<int,_std::allocator<int>_> *in_R9;
  SVOBitset *unaff_retaddr;
  conditional_t<false,_const_SVOBitset_&,_int> in_stack_00000008;
  undefined4 in_stack_0000000c;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  int in_stack_00000018;
  int m;
  conditional_t<false,_const_SVOBitset_&,_int> new_a;
  SVOBitset new_p;
  int v;
  vector<int,_std::allocator<int>_> c_save;
  int v_1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  colour_classes;
  int n;
  int p_end;
  int *p_bounds;
  int *p_order;
  SVOBitset *in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  int in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  SVOBitset *in_stack_fffffffffffffdb0;
  element_type *in_stack_fffffffffffffdb8;
  SVOBitset *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  SearchResult in_stack_fffffffffffffdcc;
  Proof *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  CliqueRunner *in_stack_fffffffffffffde0;
  CliqueRunner *in_stack_fffffffffffffde8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdf0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe20;
  CliqueRunner *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe38;
  int current_assignment;
  Watches<int,_(anonymous_namespace)::FlatWatchTable> *in_stack_fffffffffffffe40;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe48;
  Proof *in_stack_fffffffffffffe50;
  int local_1a8;
  Proof local_190 [11];
  undefined8 in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  CliqueRunner *in_stack_fffffffffffffef0;
  vector<int,_std::allocator<int>_> local_108 [2];
  int local_d8;
  int local_d4;
  int local_74;
  int local_58;
  int local_54;
  long local_50;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  SearchResult in_stack_fffffffffffffff4;
  
  *in_RDX = *in_RDX + 1;
  *in_R8 = *in_R8 + 1;
  pvVar4 = (vector<int,_std::allocator<int>_> *)
           ((long)&((in_RDI[0x291].c)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start + (long)in_stack_00000018 * 4);
  local_50 = (long)&((in_RDI[0x291].c)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start +
             (long)(in_stack_00000018 + *(int *)&in_RDI[7].c) * 4;
  local_54 = 0;
  current_assignment =
       *(int *)((long)&in_RDI->c[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + 4);
  if (current_assignment == 0) {
    colour_class_order(in_stack_fffffffffffffef0,(SVOBitset *)in_stack_fffffffffffffee8,
                       (int *)in_stack_fffffffffffffee0,(int *)in_stack_fffffffffffffed8,
                       (int *)in_stack_fffffffffffffed0);
    local_58 = local_54;
  }
  else if (current_assignment == 1) {
    colour_class_order_2df
              (in_stack_fffffffffffffef0,(SVOBitset *)in_stack_fffffffffffffee8,
               (int *)in_stack_fffffffffffffee0,(int *)in_stack_fffffffffffffed8,
               (int *)in_stack_fffffffffffffed0,(int *)in_stack_fffffffffffffec8);
    local_58 = local_54;
  }
  else {
    local_58 = local_54;
    if (current_assignment == 2) {
      colour_class_order_sorted
                ((CliqueRunner *)CONCAT44(in_stack_00000014,in_stack_00000010),
                 (SVOBitset *)CONCAT44(in_stack_0000000c,in_stack_00000008),(int *)unaff_retaddr,
                 unaff_RBX,(int *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
      local_58 = local_54;
    }
  }
  while( true ) {
    local_58 = local_58 + -1;
    if (local_58 < 0) goto LAB_001be751;
    std::__shared_ptr_access<gss::Timeout,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<gss::Timeout,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1bdb98);
    bVar1 = gss::Timeout::should_abort((Timeout *)0x1bdba0);
    if (bVar1) {
      return Aborted;
    }
    sVar3 = std::vector<int,_std::allocator<int>_>::size(in_R9);
    if (sVar3 + (long)*(int *)(local_50 + (long)local_58 * 4) <= (ulong)*(uint *)&in_RDI[1].c) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 5));
      if (bVar1) {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)0x1bdc15);
        for (local_74 = 0; local_74 <= local_58; local_74 = local_74 + 1) {
          if ((local_74 == 0) ||
             (*(int *)(local_50 + (long)(local_74 + -1) * 4) !=
              *(int *)(local_50 + (long)local_74 * 4))) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::emplace_back<>((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
          }
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe),
                     (long)*(int *)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>).
                                           _M_impl.super__Vector_impl_data._M_start +
                                   (long)local_74 * 4));
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
                     (value_type_conflict1 *)
                     CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        }
        std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1bdd18);
        gss::innards::Proof::colour_bound
                  ((Proof *)new_p._data.short_data[1],
                   (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)new_p._data.long_data);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)in_stack_fffffffffffffdb0);
      }
      goto LAB_001be751;
    }
    if (*(int *)(local_50 + (long)local_58 * 4) == local_58 + 1) break;
    local_d8 = *(int *)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + (long)local_58 * 4);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
               (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)
              );
    bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x1be0cd);
    if ((bVar1) ||
       (bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x1be0e5), bVar1)) {
      bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x1be102);
      if (((bVar1) &&
          (uVar2 = *(uint *)&in_RDI[1].c,
          puVar5 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x1be123),
          *puVar5 <= uVar2)) ||
         ((bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x1be142), bVar1
          && (uVar2 = *(uint *)&in_RDI[1].c,
             puVar5 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x1be166),
             *puVar5 <= uVar2)))) {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 5));
        if (bVar1) {
          std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1be19d);
          unpermute(in_stack_fffffffffffffde8,
                    (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0);
          gss::innards::Proof::post_solution
                    (in_stack_fffffffffffffdd0,
                     (vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0);
        }
        return DecidedTrue;
      }
    }
    else {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 5));
      if (((bVar1) &&
          (sVar3 = std::vector<int,_std::allocator<int>_>::size(in_R9),
          *(uint *)&in_RDI[1].c < sVar3)) &&
         (((ulong)in_RDI->c[8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start & 1) == 0)) {
        in_stack_fffffffffffffde0 = (CliqueRunner *)(in_RDI + 5);
        std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1be288);
        gss::innards::Proof::start_level
                  ((Proof *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
        in_stack_fffffffffffffde8 =
             (CliqueRunner *)
             std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1be29c);
        in_stack_fffffffffffffdf0 = local_108;
        unpermute_and_finish(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
        gss::innards::Proof::new_incumbent
                  ((Proof *)in_stack_fffffffffffffe40,
                   (vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                   CONCAT44(current_assignment,in_stack_fffffffffffffe38));
        std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::~vector
                  ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                   in_stack_fffffffffffffdb0);
        std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1be2f2);
        gss::innards::Proof::start_level
                  ((Proof *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
      }
      Incumbent::update((Incumbent *)in_stack_fffffffffffffdb0,
                        (vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                        (unsigned_long_long *)
                        CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                        (unsigned_long_long *)in_stack_fffffffffffffd98);
    }
    in_stack_fffffffffffffdd0 = local_190;
    gss::innards::SVOBitset::SVOBitset
              ((SVOBitset *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               in_stack_fffffffffffffd98);
    std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
              ((vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)
               (in_RDI + 8),(long)local_d8);
    gss::innards::SVOBitset::operator&=
              (in_stack_fffffffffffffdb0,
               (SVOBitset *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    pRVar6 = std::unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>::
             operator->((unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                         *)0x1be3a9);
    uVar2 = (*pRVar6->_vptr_RestartsSchedule[5])();
    in_stack_fffffffffffffddf = (undefined1)uVar2;
    if ((uVar2 & 1) != 0) {
      gss::innards::Watches<int,(anonymous_namespace)::FlatWatchTable>::
      propagate<(anonymous_namespace)::CliqueRunner::expand<false>(int,unsigned_long_long&,unsigned_long_long&,unsigned_long_long&,std::vector<int,std::allocator<int>>&,gss::innards::SVOBitset&,std::conditional<false,gss::innards::SVOBitset_const&,int>::type,int)::_lambda(int)_1_,(anonymous_namespace)::CliqueRunner::expand<false>(int,unsigned_long_long&,unsigned_long_long&,unsigned_long_long&,std::vector<int,std::allocator<int>>&,gss::innards::SVOBitset&,std::conditional<false,gss::innards::SVOBitset_const&,int>::type,int)::_lambda(int)_2_>
                (in_stack_fffffffffffffe40,current_assignment,in_RDI,
                 (anon_class_8_1_a857bcb1 *)in_stack_fffffffffffffe28);
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 5));
    if (bVar1) {
      std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1be455);
      gss::innards::Proof::start_level((Proof *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac)
      ;
    }
    bVar1 = gss::innards::SVOBitset::any
                      ((SVOBitset *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    if (!bVar1) goto switchD_001be522_default;
    in_stack_fffffffffffffda8 = in_stack_00000018 + *(int *)&in_RDI[7].c * 2;
    in_stack_fffffffffffffd98 = (SVOBitset *)local_190;
    in_stack_fffffffffffffda0 = in_stack_00000010;
    in_stack_fffffffffffffdcc =
         expand<false>((CliqueRunner *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
                       (int)((ulong)in_RDX >> 0x20),in_RCX,in_R8,(unsigned_long_long *)in_R9,pvVar4,
                       unaff_retaddr,in_stack_00000008,in_stack_00000010);
    in_stack_fffffffffffffdc0 = (SVOBitset *)(ulong)in_stack_fffffffffffffdcc;
    switch(in_stack_fffffffffffffdc0) {
    case (SVOBitset *)0x0:
      in_stack_fffffffffffffff4 = Aborted;
      local_d4 = 1;
      break;
    case (SVOBitset *)0x1:
      std::vector<int,_std::allocator<int>_>::pop_back
                ((vector<int,_std::allocator<int>_> *)0x1be56c);
      local_1a8 = local_54;
      while (local_1a8 = local_1a8 + -1, local_58 < local_1a8) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
                   (value_type_conflict1 *)
                   CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        post_nogood(in_stack_fffffffffffffde0,
                    (vector<int,_std::allocator<int>_> *)
                    CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
        std::vector<int,_std::allocator<int>_>::pop_back
                  ((vector<int,_std::allocator<int>_> *)0x1be5d4);
      }
      in_stack_fffffffffffffff4 = Restart;
      local_d4 = 1;
      break;
    case (SVOBitset *)0x2:
    default:
switchD_001be522_default:
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 5));
      if (bVar1) {
        std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1be62f);
        gss::innards::Proof::start_level
                  ((Proof *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
        in_stack_fffffffffffffdb8 =
             std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1be651);
        unpermute(in_stack_fffffffffffffde8,
                  (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0);
        gss::innards::Proof::backtrack_from_binary_variables
                  (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0);
        std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1be6a7);
        gss::innards::Proof::forget_level
                  ((Proof *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
      }
      std::vector<int,_std::allocator<int>_>::pop_back
                ((vector<int,_std::allocator<int>_> *)0x1be6ec);
      gss::innards::SVOBitset::reset
                (in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
      local_d4 = 0;
      break;
    case (SVOBitset *)0x3:
      in_stack_fffffffffffffff4 = DecidedTrue;
      local_d4 = 1;
    }
    gss::innards::SVOBitset::~SVOBitset
              ((SVOBitset *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    if (local_d4 != 0) {
      return in_stack_fffffffffffffff4;
    }
  }
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffdf0,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde8);
  for (; -1 < local_58; local_58 = local_58 + -1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
               (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)
              );
  }
  Incumbent::update((Incumbent *)in_stack_fffffffffffffdb0,
                    (vector<int,_std::allocator<int>_> *)
                    CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                    (unsigned_long_long *)
                    CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                    (unsigned_long_long *)in_stack_fffffffffffffd98);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 5));
  if ((bVar1) &&
     (bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x1bde2a), !bVar1)) {
    std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x1bde43);
    gss::innards::Proof::start_level((Proof *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
    pvVar4 = (vector<int,_std::allocator<int>_> *)
             std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1bde60);
    unpermute_and_finish(in_stack_fffffffffffffe28,pvVar4);
    gss::innards::Proof::new_incumbent
              ((Proof *)in_stack_fffffffffffffe40,
               (vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
               CONCAT44(current_assignment,in_stack_fffffffffffffe38));
    std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::~vector
              ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
               in_stack_fffffffffffffdb0);
    std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x1bdebc);
    gss::innards::Proof::start_level((Proof *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
  }
  bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x1bdf0b);
  if (((bVar1) &&
      (uVar2 = *(uint *)&in_RDI[1].c,
      puVar5 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x1bdf2f),
      *puVar5 <= uVar2)) ||
     ((bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x1bdf51), bVar1 &&
      (uVar2 = *(uint *)&in_RDI[1].c,
      puVar5 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x1bdf78),
      *puVar5 <= uVar2)))) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 5));
    if (bVar1) {
      std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1bdfb2);
      unpermute(in_stack_fffffffffffffde8,
                (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0);
      gss::innards::Proof::post_solution
                (in_stack_fffffffffffffdd0,
                 (vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0);
    }
    in_stack_fffffffffffffff4 = DecidedTrue;
    local_d4 = 1;
  }
  else {
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
               (vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    local_d4 = 3;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0);
  if (local_d4 != 1) {
LAB_001be751:
    pRVar6 = std::unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>::
             operator->((unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                         *)0x1be765);
    (*pRVar6->_vptr_RestartsSchedule[2])();
    pRVar6 = std::unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>::
             operator->((unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                         *)0x1be782);
    uVar2 = (*pRVar6->_vptr_RestartsSchedule[4])();
    if ((uVar2 & 1) == 0) {
      in_stack_fffffffffffffff4 = Complete;
    }
    else {
      post_nogood(in_stack_fffffffffffffde0,
                  (vector<int,_std::allocator<int>_> *)
                  CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
      in_stack_fffffffffffffff4 = Restart;
    }
  }
  return in_stack_fffffffffffffff4;
}

Assistant:

auto expand(
            int depth,
            unsigned long long & nodes,
            unsigned long long & find_nodes,
            unsigned long long & prove_nodes,
            vector<int> & c,
            SVOBitset & p,
            conditional_t<connected_, const SVOBitset &, int> a,
            int spacepos) -> SearchResult
        {
            ++nodes;
            ++prove_nodes;

            // initial colouring
            int * p_order = &space[spacepos];
            int * p_bounds = &space[spacepos + size];

            int p_end = 0;

            if constexpr (connected_) {
                if (! c.empty())
                    connected_colour_class_order(p, a, p_order, p_bounds, p_end);
                else
                    colour_class_order(p, p_order, p_bounds, p_end);
            }
            else {
                switch (params.colour_class_order) {
                case ColourClassOrder::ColourOrder: colour_class_order(p, p_order, p_bounds, p_end); break;
                case ColourClassOrder::SingletonsFirst: colour_class_order_2df(p, p_order, p_bounds, &space[spacepos + 2 * size], p_end); break;
                case ColourClassOrder::Sorted: colour_class_order_sorted(p, p_order, p_bounds, p_end); break;
                }
            }

            // for each v in p... (v comes later)
            for (int n = p_end - 1; n >= 0; --n) {
                // bound, timeout or early exit?
                if (params.timeout->should_abort())
                    return SearchResult::Aborted;

                if (c.size() + p_bounds[n] <= incumbent.value) {
                    if (proof) {
                        vector<vector<int>> colour_classes;
                        for (int v = 0; v <= n; ++v) {
                            if (0 == v || p_bounds[v - 1] != p_bounds[v])
                                colour_classes.emplace_back();
                            colour_classes.back().push_back(order[p_order[v]]);
                        }
                        proof->colour_bound(colour_classes);
                    }
                    break;
                }

                // if we've used k colours to colour k vertices, it's a clique. this isn't (I think?) a
                // valid shortcut in the connected case.
                if constexpr (! connected_) {
                    if (p_bounds[n] == n + 1) {
                        auto c_save = c;
                        for (; n >= 0; --n)
                            c.push_back(p_order[n]);
                        incumbent.update(c, find_nodes, prove_nodes);

                        if (proof && ! params.decide) {
                            proof->start_level(0);
                            proof->new_incumbent(unpermute_and_finish(c));
                            proof->start_level(depth + 1);
                        }

                        if ((params.decide && incumbent.value >= *params.decide) ||
                            (params.stop_after_finding && incumbent.value >= *params.stop_after_finding)) {
                            if (proof)
                                proof->post_solution(unpermute(c));

                            return SearchResult::DecidedTrue;
                        }

                        c = move(c_save);

                        break;
                    }
                }

                auto v = p_order[n];

                if constexpr (connected_) {
                    if ((! c.empty()) && (! a.test(v))) {
                        // none of the remaining vertices can give a connected underlying graph
                        if (proof) {
                            auto c_unpermuted = unpermute(c);
                            for (int v = 0; v <= n; ++v)
                                proof->not_connected_in_underlying_graph(unpermute(c), order[p_order[v]]);

                            proof->start_level(depth);
                            proof->backtrack_from_binary_variables(unpermute(c));
                            proof->forget_level(depth + 1);
                        }

                        break;
                    }
                }

                // consider taking v
                c.push_back(v);

                if (params.decide || params.stop_after_finding) {
                    if ((params.decide && incumbent.value >= *params.decide) ||
                        (params.stop_after_finding && incumbent.value >= *params.stop_after_finding)) {
                        if (proof)
                            proof->post_solution(unpermute(c));

                        return SearchResult::DecidedTrue;
                    }
                }
                else {
                    if (proof && c.size() > incumbent.value && ! params.proof_is_for_hom) {
                        proof->start_level(0);
                        proof->new_incumbent(unpermute_and_finish(c));
                        proof->start_level(depth + 1);
                    }
                    incumbent.update(c, find_nodes, prove_nodes);
                }

                // filter p to contain vertices adjacent to v
                SVOBitset new_p = p;
                new_p &= adj[v];

                if (params.restarts_schedule->might_restart())
                    watches.propagate(
                        v,
                        [&](int literal) { return c.end() == find(c.begin(), c.end(), literal); },
                        [&](int literal) { new_p.reset(literal); });

                if (proof)
                    proof->start_level(depth + 1);

                if (new_p.any()) {
                    auto new_a = a;

                    if constexpr (connected_) {
                        new_a |= connected_table[v];
                    }

                    switch (expand<connected_>(depth + 1, nodes, find_nodes, prove_nodes, c, new_p, new_a, spacepos + 2 * size)) {
                    case SearchResult::Aborted:
                        return SearchResult::Aborted;

                    case SearchResult::DecidedTrue:
                        return SearchResult::DecidedTrue;

                    case SearchResult::Complete:
                        break;

                    case SearchResult::Restart:
                        // restore assignments before posting nogoods, it's easier
                        c.pop_back();

                        // post nogoods for everything we've done so far
                        for (int m = p_end - 1; m > n; --m) {
                            c.push_back(p_order[m]);
                            post_nogood(c);
                            c.pop_back();
                        }

                        return SearchResult::Restart;
                    }
                }

                if (proof) {
                    proof->start_level(depth);
                    proof->backtrack_from_binary_variables(unpermute(c));
                    proof->forget_level(depth + 1);
                }

                // now consider not taking v
                c.pop_back();
                p.reset(v);
            }

            params.restarts_schedule->did_a_backtrack();
            if (params.restarts_schedule->should_restart()) {
                post_nogood(c);
                return SearchResult::Restart;
            }
            else
                return SearchResult::Complete;
        }